

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O3

task_handle __thiscall
oqpi::scheduler<concurrent_queue>::waitForNextTask(scheduler<concurrent_queue> *this,worker_base *w)

{
  char *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar2;
  bool bVar3;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  concurrent_queue<oqpi::task_handle> *this_01;
  int prio;
  long lVar5;
  task_handle tVar6;
  
  do {
    cVar2 = (**(code **)(*in_RDX + 0x30))();
  } while (cVar2 != '\0');
  (this->workers_).
  super__Vector_base<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>,_std::allocator<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->workers_).
  super__Vector_base<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>,_std::allocator<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Var4._M_pi = extraout_RDX;
  if ((w[7].config_.threadAttributes.name_.field_2._M_local_buf[0] & 1U) != 0) {
    lVar5 = 0;
    do {
      do {
        if ((*(uint *)(in_RDX + 8) >> ((uint)lVar5 & 0x1f) & 1) != 0) {
          this_01 = (concurrent_queue<oqpi::task_handle> *)((long)w + lVar5 * 0x78 + 0x30);
          bVar3 = concurrent_queue<oqpi::task_handle>::tryPop(this_01,(reference)this);
          while (bVar3 != false) {
            task_handle::validate((task_handle *)this);
            pcVar1 = (char *)((long)&(this->workers_).
                                     super__Vector_base<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>,_std::allocator<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[4]._M_t.
                                     super___uniq_ptr_impl<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>
                             + 1);
            LOCK();
            bVar3 = *pcVar1 == '\0';
            if (bVar3) {
              *pcVar1 = '\x01';
            }
            UNLOCK();
            if ((bVar3) &&
               (task_handle::validate((task_handle *)this), _Var4._M_pi = extraout_RDX_00,
               (*(byte *)((long)&(this->workers_).
                                 super__Vector_base<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>,_std::allocator<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[4]._M_t.
                                 super___uniq_ptr_impl<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>
                         + 2) & 1) == 0)) goto LAB_001760ef;
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (this->workers_).
                      super__Vector_base<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>,_std::allocator<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (this->workers_).
            super__Vector_base<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>,_std::allocator<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (this->workers_).
            super__Vector_base<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>,_std::allocator<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            bVar3 = concurrent_queue<oqpi::task_handle>::tryPop(this_01,(reference)this);
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
      (**(code **)(*in_RDX + 0x28))();
      do {
        cVar2 = (**(code **)(*in_RDX + 0x30))();
      } while (cVar2 != '\0');
      lVar5 = 0;
      _Var4._M_pi = extraout_RDX_01;
    } while ((w[7].config_.threadAttributes.name_.field_2._M_local_buf[0] & 1U) != 0);
  }
LAB_001760ef:
  tVar6.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  tVar6.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (task_handle)tVar6.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

task_handle waitForNextTask(worker_base &w)
        {
            const auto pumpTask = [this, &w](task_handle &hTask)
            {
                if (!running_.load())
                {
                    return true;
                }

                for (auto prio = 0; prio < PRIO_COUNT; ++prio)
                {
                    if (w.canWorkOnPriority(task_priority(prio)))
                    {
                        while (pendingTasks_[prio].tryPop(hTask))
                        {
                            // We got a task, try to grab it to ensure that we can work on it
                            // Note that a task_group can be done without being grabbed when calling activeWait
                            if (hTask.tryGrab() && !hTask.isDone())
                            {
                                // We got the go to start working on the current task
                                return true;
                            }
                            else
                            {
                                // The task has already been grabbed by someone else
                                hTask.reset();
                            }
                        }
                    }
                }

                return false;
            };

            // Before checking if we have a task decrement the semaphore count until it reaches 0
            while (w.tryWait());

            task_handle hTask;
            while (!pumpTask(hTask))
            {
                w.wait();
                while (w.tryWait());
            }

            return hTask;
        }